

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_4::Validator::EndIfExpr(Validator *this,IfExpr *expr)

{
  bool bVar1;
  Result rhs;
  Location *local_40;
  IfExpr *expr_local;
  Validator *this_local;
  
  bVar1 = intrusive_list<wabt::Expr>::empty(&expr->false_);
  if (bVar1) {
    local_40 = &(expr->true_).end_loc;
  }
  else {
    local_40 = &expr->false_end_loc;
  }
  rhs = SharedValidator::OnEnd(&this->validator_,local_40);
  Result::operator|=(&this->result_,rhs);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::EndIfExpr(IfExpr* expr) {
  result_ |= validator_.OnEnd(expr->false_.empty() ? expr->true_.end_loc
                                                   : expr->false_end_loc);
  return Result::Ok;
}